

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::ShaderProgram::ShaderProgram(ShaderProgram *this)

{
  (this->super_Item).m_type = TYPE_SHADERPROGRAM;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_001317d8;
  List::List(&this->shaders);
  this->linkStatus = false;
  (this->linkInfoLog).super_Item.m_type = TYPE_INFOLOG;
  (this->linkInfoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_00131810;
  (this->linkInfoLog).log._M_dataplus._M_p = (pointer)&(this->linkInfoLog).log.field_2;
  (this->linkInfoLog).log._M_string_length = 0;
  (this->linkInfoLog).log.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ShaderProgram		(void) : Item(TYPE_SHADERPROGRAM), linkStatus(false) {}